

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

sub_form __thiscall goodform::sub_form::at(sub_form *this,string *key,any *default_variant)

{
  sub_form sVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  local_78;
  object_validator local_40;
  any *local_30;
  any *default_variant_local;
  string *key_local;
  sub_form *this_local;
  any *local_10;
  
  local_78._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_78._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_78._M_t._M_impl._0_8_ = 0;
  local_78._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_30 = default_variant;
  default_variant_local = (any *)key;
  key_local = (string *)this;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::map(&local_78);
  local_40 = object(this,&local_78);
  sVar1 = object_validator::at(&local_40,(string *)default_variant_local,local_30);
  local_10 = sVar1.variant_;
  this_local = (sub_form *)sVar1.error_;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::~map(&local_78);
  sVar1.variant_ = local_10;
  sVar1.error_ = (error_message *)this_local;
  return sVar1;
}

Assistant:

sub_form sub_form::at(const std::string& key, const any& default_variant)
  {
    return this->object(std::map<std::string, any>()).at(key, default_variant);
  }